

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O2

int xmlHashAddEntry2(xmlHashTablePtr hash,xmlChar *key,xmlChar *key2,void *payload)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = xmlHashUpdateInternal(hash,key,key2,(xmlChar *)0x0,payload,(xmlHashDeallocator)0x0,0);
  uVar2 = uVar1;
  if (uVar1 == 1) {
    uVar2 = 0;
  }
  return uVar2 | -(uint)(uVar1 == 0);
}

Assistant:

int
xmlHashAddEntry2(xmlHashTablePtr hash, const xmlChar *key,
                 const xmlChar *key2, void *payload) {
    int res = xmlHashUpdateInternal(hash, key, key2, NULL, payload, NULL, 0);

    if (res == 0)
        res = -1;
    else if (res == 1)
        res = 0;

    return(res);
}